

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidyConfigDiffThanDefault(TidyDocImpl *doc)

{
  Bool BVar1;
  bool bVar2;
  TidyOptionValue *local_28;
  TidyOptionValue *val;
  TidyOptionImpl *option;
  Bool diff;
  TidyDocImpl *doc_local;
  
  option._4_4_ = no;
  val = (TidyOptionValue *)(option_defs + 1);
  local_28 = (doc->config).value;
  while( true ) {
    local_28 = local_28 + 1;
    bVar2 = false;
    if ((option._4_4_ == no) && (bVar2 = false, val != (TidyOptionValue *)0x0)) {
      bVar2 = val[1].v != 0;
    }
    if (!bVar2) break;
    BVar1 = OptionValueEqDefault((TidyOptionImpl *)val,local_28);
    option._4_4_ = (Bool)((BVar1 != no ^ 0xffU) & 1);
    val = val + 7;
  }
  return option._4_4_;
}

Assistant:

Bool  TY_(ConfigDiffThanDefault)( TidyDocImpl* doc )
{
  Bool diff = no;
  const TidyOptionImpl* option = option_defs + 1;
  const TidyOptionValue* val = doc->config.value + 1;
  for ( /**/; !diff && option && option->name; ++option, ++val )
  {
      diff = !OptionValueEqDefault( option, val );
  }
  return diff;
}